

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_9195::fillChannels(Rand48 *random,FlatImageLevel *level)

{
  bool bVar1;
  int iVar2;
  Rand48 *random_00;
  ostream *poVar3;
  string *psVar4;
  FlatImageChannel *pFVar5;
  Iterator *in_RDI;
  Iterator i;
  Iterator *in_stack_ffffffffffffff98;
  Iterator *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc8;
  
  Imf_3_2::FlatImageLevel::begin();
  do {
    Imf_3_2::FlatImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    random_00 = (Rand48 *)Imf_3_2::FlatImageLevel::end();
    Imf_3_2::FlatImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffffa0,
                                (ConstIterator *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"             channel ");
    psVar4 = Imf_3_2::FlatImageLevel::Iterator::name_abi_cxx11_((Iterator *)0x10bfd9);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pFVar5 = Imf_3_2::FlatImageLevel::Iterator::channel((Iterator *)0x10bfff);
    iVar2 = (*(code *)**(undefined8 **)pFVar5)();
    if (iVar2 == 0) {
      in_stack_ffffffffffffffa0 = in_RDI;
      Imf_3_2::FlatImageLevel::Iterator::channel((Iterator *)0x10c086);
      fillChannel<unsigned_int>
                (random_00,(FlatImageChannel *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    }
    else if (iVar2 == 1) {
      Imf_3_2::FlatImageLevel::Iterator::channel((Iterator *)0x10c040);
      fillChannel<Imath_3_2::half>
                (random_00,(FlatImageChannel *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    }
    else {
      if (iVar2 != 2) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                      ,0xc9,"void (anonymous namespace)::fillChannels(Rand48 &, FlatImageLevel &)");
      }
      Imf_3_2::FlatImageLevel::Iterator::channel((Iterator *)0x10c063);
      fillChannel<float>(random_00,(FlatImageChannel *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    }
    Imf_3_2::FlatImageLevel::Iterator::operator++(in_stack_ffffffffffffffa0);
  } while( true );
}

Assistant:

void
fillChannels (Rand48& random, FlatImageLevel& level)
{
    for (FlatImageLevel::Iterator i = level.begin (); i != level.end (); ++i)
    {
        cout << "             channel " << i.name () << endl;

        switch (i.channel ().pixelType ())
        {
            case HALF: fillChannel<half> (random, i.channel ()); break;

            case FLOAT: fillChannel<float> (random, i.channel ()); break;

            case UINT: fillChannel<unsigned int> (random, i.channel ()); break;

            default: assert (false);
        }
    }
}